

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O0

RunMap * google::protobuf::compiler::cpp::anon_unknown_0::FindRuns
                   (RunMap *__return_storage_ptr__,
                   vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                   *fields,function<bool_(const_google::protobuf::FieldDescriptor_*)> *predicate)

{
  FieldDescriptor *__args;
  function<bool_(const_google::protobuf::FieldDescriptor_*)> *this;
  bool bVar1;
  reference ppFVar2;
  mapped_type *pmVar3;
  FieldDescriptor *field;
  const_iterator __end3;
  const_iterator __begin3;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  *__range3;
  FieldDescriptor *last_start;
  function<bool_(const_google::protobuf::FieldDescriptor_*)> *local_20;
  function<bool_(const_google::protobuf::FieldDescriptor_*)> *predicate_local;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  *fields_local;
  RunMap *runs;
  
  last_start._7_1_ = 0;
  local_20 = predicate;
  predicate_local = (function<bool_(const_google::protobuf::FieldDescriptor_*)> *)fields;
  fields_local = (vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                  *)__return_storage_ptr__;
  std::
  unordered_map<const_google::protobuf::FieldDescriptor_*,_unsigned_long,_std::hash<const_google::protobuf::FieldDescriptor_*>,_std::equal_to<const_google::protobuf::FieldDescriptor_*>,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_unsigned_long>_>_>
  ::unordered_map(__return_storage_ptr__);
  this = predicate_local;
  __range3 = (vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              *)0x0;
  __end3 = std::
           vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
           ::begin((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                    *)predicate_local);
  field = (FieldDescriptor *)
          std::
          vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          ::end((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 *)this);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end3,(__normal_iterator<const_google::protobuf::FieldDescriptor_*const_*,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
                                     *)&field), bVar1) {
    ppFVar2 = __gnu_cxx::
              __normal_iterator<const_google::protobuf::FieldDescriptor_*const_*,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
              ::operator*(&__end3);
    __args = *ppFVar2;
    bVar1 = std::function<bool_(const_google::protobuf::FieldDescriptor_*)>::operator()
                      (local_20,__args);
    if (bVar1) {
      if (__range3 ==
          (vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
           *)0x0) {
        __range3 = (vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                    *)__args;
      }
      pmVar3 = std::
               unordered_map<const_google::protobuf::FieldDescriptor_*,_unsigned_long,_std::hash<const_google::protobuf::FieldDescriptor_*>,_std::equal_to<const_google::protobuf::FieldDescriptor_*>,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_unsigned_long>_>_>
               ::operator[](__return_storage_ptr__,(key_type *)&__range3);
      *pmVar3 = *pmVar3 + 1;
    }
    else {
      __range3 = (vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                  *)0x0;
    }
    __gnu_cxx::
    __normal_iterator<const_google::protobuf::FieldDescriptor_*const_*,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
    ::operator++(&__end3);
  }
  return __return_storage_ptr__;
}

Assistant:

RunMap FindRuns(const std::vector<const FieldDescriptor*>& fields,
                const std::function<bool(const FieldDescriptor*)>& predicate) {
  RunMap runs;
  const FieldDescriptor* last_start = nullptr;

  for (auto field : fields) {
    if (predicate(field)) {
      if (last_start == nullptr) {
        last_start = field;
      }

      runs[last_start]++;
    } else {
      last_start = nullptr;
    }
  }
  return runs;
}